

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

int __thiscall pg::SSPMSolver::compare_test(SSPMSolver *this,int pindex)

{
  int iVar1;
  int iVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  iVar1 = *this->test_d;
  if (*this->tmp_d == -1) {
    uVar6 = (uint)(iVar1 != -1);
  }
  else {
    uVar6 = 0xffffffff;
    if (iVar1 != -1) {
      if (0 < (long)this->l) {
        puVar3 = (this->tmp_b)._bits;
        puVar4 = (this->test_b)._bits;
        uVar8 = 0;
        do {
          iVar1 = this->tmp_d[uVar8];
          iVar2 = this->test_d[uVar8];
          if (pindex < iVar1 && pindex < iVar2) break;
          uVar7 = 1L << (uVar8 & 0x3f);
          if (iVar1 < iVar2) {
            bVar10 = (uVar7 & puVar3[uVar8 >> 6]) == 0;
LAB_00166d85:
            return -(uint)bVar10 | 1;
          }
          uVar9 = uVar8 >> 6;
          if (iVar2 < iVar1) {
            bVar10 = (uVar7 & puVar4[uVar9]) != 0;
            goto LAB_00166d85;
          }
          uVar5 = puVar3[uVar9];
          uVar9 = puVar4[uVar9] & uVar7;
          if (((uVar5 & uVar7) == 0) && (uVar9 != 0)) {
            return -1;
          }
          if (((uVar5 & uVar7) != 0) && (uVar9 == 0)) {
            return 1;
          }
          uVar8 = uVar8 + 1;
        } while ((long)this->l != uVar8);
      }
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

int
SSPMSolver::compare_test(int pindex)
{
    // cases involving Top
    if (tmp_d[0] == -1 and test_d[0] == -1) return 0;
    if (tmp_d[0] == -1) return 1;
    if (test_d[0] == -1) return -1;
    for (int i=0; i<l; i++) {
        if (tmp_d[i] > pindex and test_d[i] > pindex) {
            // equal until pindex, return 0
            return 0;
        } else if (tmp_d[i] < test_d[i]) {
            // equal until test has [eps]
            if (tmp_b[i] == 0) return -1;
            else return 1;
        } else if (tmp_d[i] > test_d[i]) {
            // equal until tmp has [eps]
            if (test_b[i] == 0) return 1;
            else return -1;
        } else if (tmp_b[i] < test_b[i]) {
            // equal until tmp<test
            return -1;
        } else if (tmp_b[i] > test_b[i]) {
            // equal until tmp>test
            return 1;
        }
    }
    return 0;
}